

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

void gray_sweep(gray_PWorker worker)

{
  int coverage;
  int local_28;
  TArea area;
  TArea cover;
  TCoord x;
  PCell_conflict cell;
  int y;
  gray_PWorker worker_local;
  
  for (cell._4_4_ = worker->min_ey; cell._4_4_ < worker->max_ey; cell._4_4_ = cell._4_4_ + 1) {
    _cover = worker->ycells[cell._4_4_ - worker->min_ey];
    area = worker->min_ex;
    local_28 = 0;
    for (; _cover != (PCell_conflict)0x0; _cover = _cover->next) {
      if ((local_28 != 0) && (area < _cover->x)) {
        gray_hline(worker,area,cell._4_4_,local_28,_cover->x - area);
      }
      local_28 = _cover->cover * 0x200 + local_28;
      coverage = local_28 - _cover->area;
      if ((coverage != 0) && (worker->min_ex <= _cover->x)) {
        gray_hline(worker,_cover->x,cell._4_4_,coverage,1);
      }
      area = _cover->x + 1;
    }
    if (local_28 != 0) {
      gray_hline(worker,area,cell._4_4_,local_28,worker->max_ex - area);
    }
  }
  return;
}

Assistant:

static void
  gray_sweep( RAS_ARG )
  {
    int  y;


    for ( y = ras.min_ey; y < ras.max_ey; y++ )
    {
      PCell   cell  = ras.ycells[y - ras.min_ey];
      TCoord  x     = ras.min_ex;
      TArea   cover = 0;
      TArea   area;


      for ( ; cell != NULL; cell = cell->next )
      {
        if ( cover != 0 && cell->x > x )
          gray_hline( RAS_VAR_ x, y, cover, cell->x - x );

        cover += (TArea)cell->cover * ( ONE_PIXEL * 2 );
        area   = cover - cell->area;

        if ( area != 0 && cell->x >= ras.min_ex )
          gray_hline( RAS_VAR_ cell->x, y, area, 1 );

        x = cell->x + 1;
      }

      if ( cover != 0 )
        gray_hline( RAS_VAR_ x, y, cover, ras.max_ex - x );
    }
  }